

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::WindowCursor::GetCell<duckdb::hugeint_t>(WindowCursor *this,idx_t col_idx,idx_t row_idx)

{
  idx_t iVar1;
  reference pvVar2;
  hugeint_t hVar3;
  
  iVar1 = Seek(this,row_idx);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&(this->chunk).data,col_idx);
  hVar3.upper = *(int64_t *)(pvVar2->data + iVar1 * 0x10 + 8);
  hVar3.lower = *(uint64_t *)(pvVar2->data + iVar1 * 0x10);
  return hVar3;
}

Assistant:

T GetCell(idx_t col_idx, idx_t row_idx) {
		D_ASSERT(chunk.ColumnCount() > col_idx);
		auto index = Seek(row_idx);
		auto &source = chunk.data[col_idx];
		const auto data = FlatVector::GetData<T>(source);
		return data[index];
	}